

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

shared_ptr<cxxopts::Value> __thiscall
cxxopts::value<std::__cxx11::string>
          (cxxopts *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cxxopts::Value> sVar1;
  standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  undefined8 *local_28;
  
  local_30 = (standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  local_28 = (undefined8 *)operator_new(0x88);
  local_28[1] = 0x100000001;
  *local_28 = &PTR___Sp_counted_ptr_inplace_0013a590;
  local_30 = (standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_28 + 2);
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = t;
  *(undefined2 *)(local_28 + 8) = 0;
  local_28[9] = local_28 + 0xb;
  local_28[10] = 0;
  *(undefined1 *)(local_28 + 0xb) = 0;
  local_28[0xd] = local_28 + 0xf;
  local_28[0xe] = 0;
  *(undefined1 *)(local_28 + 0xf) = 0;
  local_28[2] = &PTR__abstract_value_0013a5e0;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cxxopts::values::standard_value<std::__cxx11::string>,cxxopts::values::standard_value<std::__cxx11::string>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_30,local_30);
  *(standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    **)this = local_30;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 **)(this + 8) = local_28;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
  value(T& t)
  {
    return std::make_shared<values::standard_value<T>>(&t);
  }